

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionSpecConstantTriple
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  DiagnosticStream DStack_1f8;
  
  uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  bVar1 = IsUint32Constant(_,uVar2);
  if (bVar1) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar1 = IsUint32Constant(_,uVar2);
    if (bVar1) {
      uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,6);
      bVar1 = IsUint32Constant(_,uVar2);
      if (bVar1) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar3 = "Z must be a 32-bit unsigned integer OpConstant";
    }
    else {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar3 = "Y must be a 32-bit unsigned integer OpConstant";
    }
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
    pcVar3 = "X must be a 32-bit unsigned integer OpConstant";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar3,0x2e);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateClspvReflectionSpecConstantTriple(
    ValidationState_t& _, const Instruction* inst) {
  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(4))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "X must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(5))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Y must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Z must be a 32-bit unsigned integer OpConstant";
  }

  return SPV_SUCCESS;
}